

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O0

HTS_File * HTS_fopen_from_data(void *data,size_t size)

{
  undefined8 *size_00;
  void *pvVar1;
  size_t in_RSI;
  void *in_RDI;
  HTS_File *f;
  HTS_Data *d;
  size_t in_stack_ffffffffffffffe0;
  HTS_File *local_8;
  
  if ((in_RDI == (void *)0x0) || (in_RSI == 0)) {
    local_8 = (HTS_File *)0x0;
  }
  else {
    size_00 = (undefined8 *)HTS_calloc(in_RSI,in_stack_ffffffffffffffe0);
    pvVar1 = HTS_calloc(in_RSI,(size_t)size_00);
    *size_00 = pvVar1;
    size_00[1] = in_RSI;
    size_00[2] = 0;
    memcpy((void *)*size_00,in_RDI,in_RSI);
    local_8 = (HTS_File *)HTS_calloc(in_RSI,(size_t)size_00);
    local_8->type = '\x01';
    local_8->pointer = size_00;
  }
  return local_8;
}

Assistant:

HTS_File *HTS_fopen_from_data(void *data, size_t size)
{
   HTS_Data *d;
   HTS_File *f;

   if (data == NULL || size == 0)
      return NULL;

   d = (HTS_Data *) HTS_calloc(1, sizeof(HTS_Data));
   d->data = (unsigned char *) HTS_calloc(size, sizeof(unsigned char));
   d->size = size;
   d->index = 0;

   memcpy(d->data, data, size);

   f = (HTS_File *) HTS_calloc(1, sizeof(HTS_File));
   f->type = HTS_DATA;
   f->pointer = (void *) d;

   return f;
}